

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFLTKWrapUICommand.cxx
# Opt level: O0

bool __thiscall
cmFLTKWrapUICommand::InitialPass
          (cmFLTKWrapUICommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *this_00;
  cmMakefile *pcVar1;
  bool bVar2;
  size_type sVar3;
  char *pcVar4;
  const_reference pvVar5;
  reference pbVar6;
  cmSourceFile *pcVar7;
  reference ppcVar8;
  string *psVar9;
  byte local_459;
  undefined1 local_3f8 [8];
  string varName;
  size_t classNum;
  string sourceListValue;
  size_t lastHeadersClass;
  allocator local_399;
  string local_398;
  allocator local_371;
  string local_370;
  cmSourceFile *local_350;
  cmSourceFile *sf;
  char *no_working_dir;
  char *no_comment;
  undefined1 local_330 [8];
  string no_main_dependency;
  cmCustomCommandLines commandLines;
  value_type local_2f0;
  allocator local_2c9;
  value_type local_2c8;
  allocator local_2a1;
  value_type local_2a0;
  allocator local_279;
  value_type local_278;
  undefined1 local_258 [8];
  cmCustomCommandLine commandLine;
  string cxxres;
  value_type local_218;
  undefined1 local_1f8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  undefined1 local_1c0 [8];
  string origname;
  string hname;
  string local_160 [8];
  string outName;
  string local_138;
  cmSourceFile *local_118;
  cmSourceFile *curr;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_100;
  const_iterator i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputDirectories;
  undefined1 local_d8 [8];
  string outputDirectory;
  string local_b0;
  char *local_90;
  char *fluid_exe;
  undefined1 local_80 [8];
  string cdir;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFLTKWrapUICommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar3 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
  }
  else {
    pcVar4 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_80,pcVar4,(allocator *)((long)&fluid_exe + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&fluid_exe + 7));
    pcVar1 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_b0,"FLTK_FLUID_EXECUTABLE",
               (allocator *)(outputDirectory.field_2._M_local_buf + 0xf));
    pcVar4 = cmMakefile::GetRequiredDefinition(pcVar1,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator
              ((allocator<char> *)(outputDirectory.field_2._M_local_buf + 0xf));
    local_90 = pcVar4;
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,0);
    std::__cxx11::string::operator=((string *)&this->Target,(string *)pvVar5);
    pcVar4 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_d8,pcVar4,
               (allocator *)
               ((long)&outputDirectories.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&outputDirectories.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&i);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&i,(value_type *)local_d8);
    cmMakefile::AddIncludeDirectories
              ((this->super_cmCommand).Makefile,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&i,false);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&i);
    local_108._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)param_2_local);
    local_100 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator+(&local_108,1);
    while( true ) {
      curr = (cmSourceFile *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local);
      bVar2 = __gnu_cxx::operator!=
                        (&local_100,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&curr);
      if (!bVar2) break;
      pcVar1 = (this->super_cmCommand).Makefile;
      pbVar6 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_100);
      pcVar7 = cmMakefile::GetSource(pcVar1,pbVar6);
      outName.field_2._M_local_buf[0xe] = '\0';
      outName.field_2._M_local_buf[0xd] = '\0';
      local_459 = 1;
      local_118 = pcVar7;
      if (pcVar7 != (cmSourceFile *)0x0) {
        std::allocator<char>::allocator();
        outName.field_2._M_local_buf[0xe] = '\x01';
        std::__cxx11::string::string
                  ((string *)&local_138,"WRAP_EXCLUDE",
                   (allocator *)(outName.field_2._M_local_buf + 0xf));
        outName.field_2._M_local_buf[0xd] = '\x01';
        bVar2 = cmSourceFile::GetPropertyAsBool(pcVar7,&local_138);
        local_459 = bVar2 ^ 0xff;
      }
      if ((outName.field_2._M_local_buf[0xd] & 1U) != 0) {
        std::__cxx11::string::~string((string *)&local_138);
      }
      if ((outName.field_2._M_local_buf[0xe] & 1U) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)(outName.field_2._M_local_buf + 0xf));
      }
      if ((local_459 & 1) != 0) {
        std::__cxx11::string::string(local_160,(string *)local_d8);
        std::__cxx11::string::operator+=(local_160,"/");
        pbVar6 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_100);
        cmsys::SystemTools::GetFilenameWithoutExtension((string *)((long)&hname.field_2 + 8),pbVar6)
        ;
        std::__cxx11::string::operator+=(local_160,(string *)(hname.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(hname.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)(origname.field_2._M_local_buf + 8),local_160);
        std::__cxx11::string::operator+=((string *)(origname.field_2._M_local_buf + 8),".h");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &depends.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                       ,"/");
        pbVar6 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_100);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &depends.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,pbVar6);
        std::__cxx11::string::~string
                  ((string *)
                   &depends.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1f8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1f8,(value_type *)local_1c0);
        pcVar4 = local_90;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_218,pcVar4,(allocator *)(cxxres.field_2._M_local_buf + 0xf));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1f8,&local_218);
        std::__cxx11::string::~string((string *)&local_218);
        std::allocator<char>::~allocator((allocator<char> *)(cxxres.field_2._M_local_buf + 0xf));
        std::__cxx11::string::string
                  ((string *)
                   &commandLine.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,local_160);
        std::__cxx11::string::operator+=
                  ((string *)
                   &commandLine.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,".cxx");
        cmCustomCommandLine::cmCustomCommandLine((cmCustomCommandLine *)local_258);
        pcVar4 = local_90;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_278,pcVar4,&local_279);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_258,&local_278);
        std::__cxx11::string::~string((string *)&local_278);
        std::allocator<char>::~allocator((allocator<char> *)&local_279);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2a0,"-c",&local_2a1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_258,&local_2a0);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2c8,"-h",&local_2c9);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_258,&local_2c8);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_258,(value_type *)((long)&origname.field_2 + 8));
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_2f0,"-o",
                   (allocator *)
                   ((long)&commandLines.
                           super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                           super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_258,&local_2f0);
        std::__cxx11::string::~string((string *)&local_2f0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&commandLines.
                           super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                           super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_258,
                    (value_type *)
                    &commandLine.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_258,(value_type *)local_1c0);
        this_00 = (vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                  ((long)&no_main_dependency.field_2 + 8);
        cmCustomCommandLines::cmCustomCommandLines((cmCustomCommandLines *)this_00);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                  (this_00,(value_type *)local_258);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_330,"",(allocator *)((long)&no_comment + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&no_comment + 7));
        no_working_dir = (char *)0x0;
        sf = (cmSourceFile *)0x0;
        cmMakefile::AddCustomCommandToOutput
                  ((this->super_cmCommand).Makefile,
                   (string *)
                   &commandLine.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1f8,(string *)local_330,
                   (cmCustomCommandLines *)((long)&no_main_dependency.field_2 + 8),(char *)0x0,
                   (char *)0x0,false,true,false);
        cmMakefile::AddCustomCommandToOutput
                  ((this->super_cmCommand).Makefile,(string *)((long)&origname.field_2 + 8),
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1f8,(string *)local_330,
                   (cmCustomCommandLines *)((long)&no_main_dependency.field_2 + 8),no_working_dir,
                   (char *)sf,false,true,false);
        pcVar7 = cmMakefile::GetSource
                           ((this->super_cmCommand).Makefile,
                            (string *)
                            &commandLine.
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_350 = pcVar7;
        pcVar4 = (char *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_370,pcVar4,&local_371);
        cmSourceFile::AddDepend(pcVar7,&local_370);
        std::__cxx11::string::~string((string *)&local_370);
        std::allocator<char>::~allocator((allocator<char> *)&local_371);
        pcVar7 = local_350;
        pcVar4 = (char *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_398,pcVar4,&local_399);
        cmSourceFile::AddDepend(pcVar7,&local_398);
        std::__cxx11::string::~string((string *)&local_398);
        std::allocator<char>::~allocator((allocator<char> *)&local_399);
        std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
                  (&this->GeneratedSourcesClasses,&local_350);
        std::__cxx11::string::~string((string *)local_330);
        cmCustomCommandLines::~cmCustomCommandLines
                  ((cmCustomCommandLines *)((long)&no_main_dependency.field_2 + 8));
        cmCustomCommandLine::~cmCustomCommandLine((cmCustomCommandLine *)local_258);
        std::__cxx11::string::~string
                  ((string *)
                   &commandLine.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1f8);
        std::__cxx11::string::~string((string *)local_1c0);
        std::__cxx11::string::~string((string *)(origname.field_2._M_local_buf + 8));
        std::__cxx11::string::~string(local_160);
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_100,0);
    }
    sourceListValue.field_2._8_8_ =
         std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::size
                   (&this->GeneratedSourcesClasses);
    std::__cxx11::string::string((string *)&classNum);
    for (varName.field_2._8_8_ = 0;
        (ulong)varName.field_2._8_8_ < (ulong)sourceListValue.field_2._8_8_;
        varName.field_2._8_8_ = varName.field_2._8_8_ + 1) {
      if (varName.field_2._8_8_ != 0) {
        std::__cxx11::string::operator+=((string *)&classNum,";");
      }
      ppcVar8 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::operator[]
                          (&this->GeneratedSourcesClasses,varName.field_2._8_8_);
      psVar9 = cmSourceFile::GetFullPath(*ppcVar8,(string *)0x0);
      std::__cxx11::string::operator+=((string *)&classNum,(string *)psVar9);
    }
    std::__cxx11::string::string((string *)local_3f8,(string *)&this->Target);
    std::__cxx11::string::operator+=((string *)local_3f8,"_FLTK_UI_SRCS");
    pcVar1 = (this->super_cmCommand).Makefile;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(pcVar1,(string *)local_3f8,pcVar4);
    this_local._7_1_ = 1;
    std::__cxx11::string::~string((string *)local_3f8);
    std::__cxx11::string::~string((string *)&classNum);
    std::__cxx11::string::~string((string *)local_d8);
    std::__cxx11::string::~string((string *)local_80);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFLTKWrapUICommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  // what is the current source dir
  std::string cdir = this->Makefile->GetCurrentSourceDirectory();
  const char* fluid_exe =
    this->Makefile->GetRequiredDefinition("FLTK_FLUID_EXECUTABLE");

  // get parameter for the command
  this->Target = args[0];  // Target that will use the generated files

  // get the list of GUI files from which .cxx and .h will be generated
  std::string outputDirectory = this->Makefile->GetCurrentBinaryDirectory();

  {
  // Some of the generated files are *.h so the directory "GUI"
  // where they are created have to be added to the include path
  std::vector<std::string> outputDirectories;
  outputDirectories.push_back(outputDirectory);
  this->Makefile->AddIncludeDirectories( outputDirectories );
  }

  for(std::vector<std::string>::const_iterator i = (args.begin() + 1);
      i != args.end(); i++)
    {
    cmSourceFile *curr = this->Makefile->GetSource(*i);
    // if we should use the source GUI
    // to generate .cxx and .h files
    if (!curr || !curr->GetPropertyAsBool("WRAP_EXCLUDE"))
      {
      std::string outName = outputDirectory;
      outName += "/";
      outName += cmSystemTools::GetFilenameWithoutExtension(*i);
      std::string hname = outName;
      hname += ".h";
      std::string origname = cdir + "/" + *i;
      // add starting depends
      std::vector<std::string> depends;
      depends.push_back(origname);
      depends.push_back(fluid_exe);
      std::string cxxres = outName;
      cxxres += ".cxx";

      cmCustomCommandLine commandLine;
      commandLine.push_back(fluid_exe);
      commandLine.push_back("-c"); // instructs Fluid to run in command line
      commandLine.push_back("-h"); // optionally rename .h files
      commandLine.push_back(hname);
      commandLine.push_back("-o"); // optionally rename .cxx files
      commandLine.push_back(cxxres);
      commandLine.push_back(origname);// name of the GUI fluid file
      cmCustomCommandLines commandLines;
      commandLines.push_back(commandLine);

      // Add command for generating the .h and .cxx files
      std::string no_main_dependency = "";
      const char* no_comment = 0;
      const char* no_working_dir = 0;
      this->Makefile->AddCustomCommandToOutput(cxxres,
                                           depends, no_main_dependency,
                                           commandLines, no_comment,
                                           no_working_dir);
      this->Makefile->AddCustomCommandToOutput(hname,
                                           depends, no_main_dependency,
                                           commandLines, no_comment,
                                           no_working_dir);

      cmSourceFile *sf = this->Makefile->GetSource(cxxres);
      sf->AddDepend(hname.c_str());
      sf->AddDepend(origname.c_str());
      this->GeneratedSourcesClasses.push_back(sf);
      }
    }

  // create the variable with the list of sources in it
  size_t lastHeadersClass = this->GeneratedSourcesClasses.size();
  std::string sourceListValue;
  for(size_t classNum = 0; classNum < lastHeadersClass; classNum++)
    {
    if (classNum)
      {
      sourceListValue += ";";
      }
    sourceListValue += this->GeneratedSourcesClasses[classNum]->GetFullPath();
    }
  std::string varName = this->Target;
  varName += "_FLTK_UI_SRCS";
  this->Makefile->AddDefinition(varName, sourceListValue.c_str());

  return true;
}